

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_containers_bitset.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  container_type cVar3;
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
  color_bitset;
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_> local_19;
  
  local_19.a._M_elems[0] = (container_type)(_Type)0x0;
  magic_enum::containers::
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::set
            (&local_19,GREEN,true);
  magic_enum::containers::
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::set
            (&local_19,BLUE,true);
  *(uint *)(std::ostream::_M_insert<bool> + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::_M_insert<bool> + *(long *)(std::cout + -0x18)) | 1;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  cVar3._M_elems[0] = (_Type)(_Type)local_19.a._M_elems[0];
  if (local_19.a._M_elems[0] != (_Type)0x0) {
    do {
      bVar1 = '\x01' < (byte)cVar3._M_elems[0];
      cVar3._M_elems[0] = (_Type)(_Type)(cVar3._M_elems[0] >> 1);
    } while (bVar1);
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  magic_enum::containers::
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::test
            (&local_19,RED);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  magic_enum::containers::
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::test
            (&local_19,GREEN);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  magic_enum::containers::
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::test
            (&local_19,BLUE);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {

  auto color_bitset = magic_enum::containers::bitset<Color>();
  color_bitset.set(Color::GREEN);
  color_bitset.set(Color::BLUE);

  std::cout << std::boolalpha;
  std::cout << color_bitset.size() << std::endl; // 3 == magic_enum::enum_count<Color>()
  std::cout << color_bitset.all() << std::endl; // false
  std::cout << color_bitset.any() << std::endl; // true
  std::cout << color_bitset.none() << std::endl; // false
  std::cout << color_bitset.count() << std::endl; // 2
  std::cout << color_bitset.test(Color::RED) << std::endl; // false
  std::cout << color_bitset.test(Color::GREEN) << std::endl; // true
  std::cout << color_bitset.test(Color::BLUE) << std::endl; // true

  return 0;
}